

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O1

void render_html_escaped(MD_HTML *r,MD_CHAR *data,MD_SIZE size)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  MD_SIZE MVar6;
  uint uVar7;
  MD_SIZE MVar8;
  char *pcVar9;
  bool bVar10;
  
  uVar7 = 0;
  do {
    uVar4 = (ulong)uVar7;
    if (uVar7 + 3 < size) {
      uVar4 = (ulong)uVar7;
      while (((iVar3 = (int)uVar4, (r->escape_map[(byte)data[uVar4]] & 1U) == 0 &&
              ((r->escape_map[(byte)data[iVar3 + 1]] & 1U) == 0)) &&
             ((r->escape_map[(byte)data[iVar3 + 2]] & 1U) == 0))) {
        if (((r->escape_map[(byte)data[iVar3 + 3]] & 1U) != 0) ||
           (uVar4 = (ulong)(iVar3 + 4), size <= iVar3 + 7U)) break;
      }
    }
    MVar6 = (MD_SIZE)uVar4;
    bVar10 = MVar6 < size;
    if ((bVar10) && ((r->escape_map[(byte)data[uVar4]] & 1U) == 0)) {
      do {
        iVar3 = (int)uVar4;
        MVar6 = size;
        if (size - 1 == iVar3) goto LAB_0010db5f;
        lVar2 = uVar4 + 1;
        uVar4 = uVar4 + 1;
      } while ((r->escape_map[(byte)data[lVar2]] & 1U) == 0);
      MVar6 = (MD_SIZE)uVar4;
LAB_0010db5f:
      bVar10 = iVar3 + 1U < size;
    }
    if (uVar7 <= MVar6 && MVar6 - uVar7 != 0) {
      (*r->process_output)(data + uVar7,MVar6 - uVar7,r->userdata);
    }
    if (!bVar10) {
      return;
    }
    bVar1 = data[MVar6];
    if (bVar1 < 0x3c) {
      if (bVar1 == 0x22) {
        pvVar5 = r->userdata;
        pcVar9 = "&quot;";
        MVar8 = 6;
        goto LAB_0010dbdf;
      }
      if (bVar1 == 0x26) {
        pvVar5 = r->userdata;
        pcVar9 = "&amp;";
        MVar8 = 5;
        goto LAB_0010dbdf;
      }
    }
    else {
      if (bVar1 == 0x3c) {
        pvVar5 = r->userdata;
        pcVar9 = "&lt;";
      }
      else {
        if (bVar1 != 0x3e) goto LAB_0010dbe2;
        pvVar5 = r->userdata;
        pcVar9 = "&gt;";
      }
      MVar8 = 4;
LAB_0010dbdf:
      (*r->process_output)(pcVar9,MVar8,pvVar5);
    }
LAB_0010dbe2:
    uVar7 = MVar6 + 1;
  } while( true );
}

Assistant:

static void
render_html_escaped(MD_HTML* r, const MD_CHAR* data, MD_SIZE size)
{
    MD_OFFSET beg = 0;
    MD_OFFSET off = 0;

    /* Some characters need to be escaped in normal HTML text. */
    #define NEED_HTML_ESC(ch)   (r->escape_map[(unsigned char)(ch)] & NEED_HTML_ESC_FLAG)

    while(1) {
        /* Optimization: Use some loop unrolling. */
        while(off + 3 < size  &&  !NEED_HTML_ESC(data[off+0])  &&  !NEED_HTML_ESC(data[off+1])
                              &&  !NEED_HTML_ESC(data[off+2])  &&  !NEED_HTML_ESC(data[off+3]))
            off += 4;
        while(off < size  &&  !NEED_HTML_ESC(data[off]))
            off++;

        if(off > beg)
            render_verbatim(r, data + beg, off - beg);

        if(off < size) {
            switch(data[off]) {
                case '&':   RENDER_VERBATIM(r, "&amp;"); break;
                case '<':   RENDER_VERBATIM(r, "&lt;"); break;
                case '>':   RENDER_VERBATIM(r, "&gt;"); break;
                case '"':   RENDER_VERBATIM(r, "&quot;"); break;
            }
            off++;
        } else {
            break;
        }
        beg = off;
    }
}